

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.h
# Opt level: O0

vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
* __thiscall
phmap::priv::GenerateValuesWithSeed<std::pair<std::pair<int,int>,std::pair<int,int>>>
          (vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
           *__return_storage_ptr__,priv *this,size_t n,int maxval,int seed)

{
  const_reference pvVar1;
  pair<std::pair<int,_int>,_std::pair<int,_int>_> pVar2;
  pair<std::pair<int,_int>,_std::pair<int,_int>_> local_70;
  priv *local_60;
  size_t i;
  undefined1 local_48 [8];
  Generator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_> gen;
  vector<int,_std::allocator<int>_> nums;
  int seed_local;
  int maxval_local;
  size_t n_local;
  vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  *vec;
  
  GenerateNumbersWithSeed((vector<int,_std::allocator<int>_> *)&gen.ugen,(size_t)this,(int)n,maxval)
  ;
  Generator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>::Generator
            ((Generator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_> *)local_48,(int)n);
  i._3_1_ = 0;
  std::
  vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  ::vector(__return_storage_ptr__);
  std::
  vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  ::reserve(__return_storage_ptr__,(size_type)this);
  for (local_60 = (priv *)0x0; local_60 < this; local_60 = local_60 + 1) {
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&gen.ugen,(size_type)local_60);
    pVar2 = Generator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>::operator()
                      ((Generator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_> *)local_48,
                       *pvVar1);
    local_70 = pVar2;
    std::
    vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
    ::push_back(__return_storage_ptr__,&local_70);
  }
  i._3_1_ = 1;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&gen.ugen);
  return __return_storage_ptr__;
}

Assistant:

std::vector<V> GenerateValuesWithSeed(size_t n, int maxval, int seed) {
        const std::vector<int> nums = GenerateNumbersWithSeed(n, maxval, seed);
        Generator<V> gen(maxval);
        std::vector<V> vec;

        vec.reserve(n);
        for (size_t i = 0; i < n; i++) {
            vec.push_back(gen(nums[i]));
        }

        return vec;
    }